

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_243097::TfFinder::~TfFinder(TfFinder *this)

{
  (this->super_TokenFilter)._vptr_TokenFilter = (_func_int **)&PTR__TfFinder_002b06d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->DA);
  std::__cxx11::string::~string((string *)&this->last_name);
  std::__cxx11::string::~string((string *)&this->font_name);
  return;
}

Assistant:

~TfFinder() override = default;